

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_conversion.cpp
# Opt level: O3

void duckdb::ConvertDecimal<long*>
               (long *src_ptr,Vector *vector,ArrowArray *array,idx_t size,int64_t nested_offset,
               uint64_t parent_offset,ArrowScanLocalState *scan_state,ValidityMask *val_mask,
               DecimalBitWidth arrow_bit_width)

{
  PhysicalType type;
  unsigned_long *puVar1;
  void *pvVar2;
  idx_t iVar3;
  long lVar4;
  NotImplementedException *this;
  PhysicalType type_00;
  ulong uVar5;
  int32_t *result;
  hugeint_t *result_00;
  int16_t *result_01;
  int64_t *result_02;
  string local_70;
  string local_50;
  
  type = (vector->type).physical_type_;
  if (type < INT64) {
    if (type == INT16) {
      if (size == 0) {
        return;
      }
      result_01 = (int16_t *)vector->data;
      uVar5 = 0;
      do {
        puVar1 = (val_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if ((puVar1 == (unsigned_long *)0x0) || ((puVar1[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) != 0)) {
          TryCast::Operation<long,short>(src_ptr[uVar5],result_01,false);
        }
        uVar5 = uVar5 + 1;
        result_01 = result_01 + 1;
      } while (size != uVar5);
      return;
    }
    if (type != INT32) {
LAB_00a70dcb:
      this = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"Unsupported physical type for Decimal: %s","");
      TypeIdToString_abi_cxx11_(&local_50,(duckdb *)(ulong)(vector->type).physical_type_,type_00);
      NotImplementedException::NotImplementedException<std::__cxx11::string>
                (this,&local_70,&local_50);
      __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (arrow_bit_width != DECIMAL_32) {
      if (size == 0) {
        return;
      }
      result = (int32_t *)vector->data;
      uVar5 = 0;
      do {
        puVar1 = (val_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if ((puVar1 == (unsigned_long *)0x0) || ((puVar1[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) != 0)) {
          TryCast::Operation<long,int>(src_ptr[uVar5],result,false);
        }
        uVar5 = uVar5 + 1;
        result = result + 1;
      } while (size != uVar5);
      return;
    }
  }
  else if (type == INT64) {
    if (arrow_bit_width != DECIMAL_64) {
      if (size == 0) {
        return;
      }
      result_02 = (int64_t *)vector->data;
      uVar5 = 0;
      do {
        puVar1 = (val_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if ((puVar1 == (unsigned_long *)0x0) || ((puVar1[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) != 0)) {
          TryCast::Operation<long,long>(src_ptr[uVar5],result_02,false);
        }
        uVar5 = uVar5 + 1;
        result_02 = result_02 + 1;
      } while (size != uVar5);
      return;
    }
  }
  else {
    if (type != INT128) goto LAB_00a70dcb;
    if (arrow_bit_width != DECIMAL_128) {
      if (size == 0) {
        return;
      }
      result_00 = (hugeint_t *)vector->data;
      uVar5 = 0;
      do {
        puVar1 = (val_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if ((puVar1 == (unsigned_long *)0x0) || ((puVar1[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) != 0)) {
          TryCast::Operation<long,duckdb::hugeint_t>(src_ptr[uVar5],result_00,false);
        }
        uVar5 = uVar5 + 1;
        result_00 = result_00 + 1;
      } while (size != uVar5);
      return;
    }
  }
  pvVar2 = array->buffers[1];
  iVar3 = GetTypeIdSize(type);
  lVar4 = NumericCastImpl<long,_unsigned_long,_false>::Convert(parent_offset);
  lVar4 = lVar4 + array->offset + scan_state->chunk_offset;
  if (nested_offset != -1) {
    lVar4 = array->offset + nested_offset;
  }
  vector->data = (data_ptr_t)(lVar4 * iVar3 + (long)pvVar2);
  return;
}

Assistant:

void ConvertDecimal(SRC src_ptr, Vector &vector, ArrowArray &array, idx_t size, int64_t nested_offset,
                    uint64_t parent_offset, ArrowScanLocalState &scan_state, ValidityMask &val_mask,
                    DecimalBitWidth arrow_bit_width) {

	switch (vector.GetType().InternalType()) {
	case PhysicalType::INT16: {
		auto tgt_ptr = FlatVector::GetData<int16_t>(vector);
		for (idx_t row = 0; row < size; row++) {
			if (val_mask.RowIsValid(row)) {
				auto result = TryCast::Operation(src_ptr[row], tgt_ptr[row]);
				D_ASSERT(result);
				(void)result;
			}
		}
		break;
	}
	case PhysicalType::INT32: {
		if (arrow_bit_width == DecimalBitWidth::DECIMAL_32) {
			FlatVector::SetData(vector, ArrowBufferData<data_t>(array, 1) +
			                                GetTypeIdSize(vector.GetType().InternalType()) *
			                                    GetEffectiveOffset(array, NumericCast<int64_t>(parent_offset),
			                                                       scan_state, nested_offset));
		} else {
			auto tgt_ptr = FlatVector::GetData<int32_t>(vector);
			for (idx_t row = 0; row < size; row++) {
				if (val_mask.RowIsValid(row)) {
					auto result = TryCast::Operation(src_ptr[row], tgt_ptr[row]);
					D_ASSERT(result);
					(void)result;
				}
			}
		}
		break;
	}
	case PhysicalType::INT64: {
		if (arrow_bit_width == DecimalBitWidth::DECIMAL_64) {
			FlatVector::SetData(vector, ArrowBufferData<data_t>(array, 1) +
			                                GetTypeIdSize(vector.GetType().InternalType()) *
			                                    GetEffectiveOffset(array, NumericCast<int64_t>(parent_offset),
			                                                       scan_state, nested_offset));
		} else {
			auto tgt_ptr = FlatVector::GetData<int64_t>(vector);
			for (idx_t row = 0; row < size; row++) {
				if (val_mask.RowIsValid(row)) {
					auto result = TryCast::Operation(src_ptr[row], tgt_ptr[row]);
					D_ASSERT(result);
					(void)result;
				}
			}
		}
		break;
	}
	case PhysicalType::INT128: {
		if (arrow_bit_width == DecimalBitWidth::DECIMAL_128) {
			FlatVector::SetData(vector, ArrowBufferData<data_t>(array, 1) +
			                                GetTypeIdSize(vector.GetType().InternalType()) *
			                                    GetEffectiveOffset(array, NumericCast<int64_t>(parent_offset),
			                                                       scan_state, nested_offset));
		} else {
			auto tgt_ptr = FlatVector::GetData<hugeint_t>(vector);
			for (idx_t row = 0; row < size; row++) {
				if (val_mask.RowIsValid(row)) {
					auto result = TryCast::Operation(src_ptr[row], tgt_ptr[row]);
					D_ASSERT(result);
					(void)result;
				}
			}
		}

		break;
	}
	default:
		throw NotImplementedException("Unsupported physical type for Decimal: %s",
		                              TypeIdToString(vector.GetType().InternalType()));
	}
}